

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O2

Box * __thiscall libDAI::Box::normalized(Box *__return_storage_ptr__,Box *this)

{
  size_t l;
  ulong uVar1;
  long lVar2;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  
  extremePoints(&ep,this);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)ep.
                             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ep.
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar1 = uVar1 + 1) {
    TProb<double>::normalize
              ((TProb<double> *)
               ((long)&((ep.
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_p).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2),NORMPROB);
    lVar2 = lVar2 + 0x18;
  }
  Box(__return_storage_ptr__,&this->_vars,&ep);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector(&ep);
  return __return_storage_ptr__;
}

Assistant:

Box normalized() const {
                std::vector<Prob> ep = extremePoints();
                for( size_t l = 0; l < ep.size(); l++ )
                    ep[l].normalize();
                return Box( _vars, ep );
            }